

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void cm_wake_any_pending_write(CMConnection conn)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long *in_RDI;
  timespec ts_1;
  timespec ts;
  size_t callback_len;
  CMConnHandlerListEntry callbacks [16];
  int i;
  CManager_conflict in_stack_fffffffffffffea0;
  timespec local_140;
  __time_t local_130;
  undefined4 local_128;
  CMTraceType in_stack_fffffffffffffedc;
  CManager in_stack_fffffffffffffee0;
  CManager cm;
  long local_118 [33];
  uint local_c;
  long *local_8;
  
  local_8 = in_RDI;
  if (in_RDI[0xb] != 0) {
    local_c = 0;
    cm = (CManager)in_RDI[10];
    if (0x10 < (ulong)in_RDI[10]) {
      __assert_fail("conn->write_callback_len <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xb62,"void cm_wake_any_pending_write(CMConnection)");
    }
    memcpy(local_118,(void *)in_RDI[0xb],in_RDI[10] << 4);
    for (local_c = 0; (CManager)(long)(int)local_c < cm; local_c = local_c + 1) {
      if (local_118[(long)(int)local_c * 2] != 0) {
        (*(code *)local_118[(long)(int)local_c * 2])
                  (*local_8,local_8,local_118[(long)(int)local_c * 2 + 1]);
      }
    }
    iVar1 = CMtrace_val[5];
    if (*(long *)(*local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(cm,in_stack_fffffffffffffedc);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = *(FILE **)(*local_8 + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_130);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_130,
                CONCAT44(in_stack_fffffffffffffedc,local_128));
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"Completed pending write, did %d notifications\n",
              (ulong)local_c);
    }
    fflush(*(FILE **)(*local_8 + 0x120));
    goto LAB_00125328;
  }
  if (*(long *)(*in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if (iVar1 != 0) {
LAB_00125251:
      if (CMtrace_PID != 0) {
        in_stack_fffffffffffffea0 = *(CManager_conflict *)(*local_8 + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf((FILE *)in_stack_fffffffffffffea0,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_140);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_140.tv_sec,local_140.tv_nsec);
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"Completed pending write, No notifications\n");
    }
  }
  else if (CMtrace_val[5] != 0) goto LAB_00125251;
  fflush(*(FILE **)(*local_8 + 0x120));
LAB_00125328:
  CMwake_server_thread(in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void
 cm_wake_any_pending_write(CMConnection conn)
 {
     if (conn->write_callbacks) {
	 int i = 0;
	 CMConnHandlerListEntry callbacks[16];
	 size_t callback_len = conn->write_callback_len;
	 assert(conn->write_callback_len <= 16);
	 memcpy(callbacks, conn->write_callbacks, sizeof(callbacks[0]) * conn->write_callback_len);
	 for (i = 0; i < callback_len; ++i) {
	     if (callbacks[i].func) {
		 (callbacks[i].func)(conn->cm, conn, callbacks[i].client_data);
	     }
	 }
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, did %d notifications\n", i);
     } else {
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, No notifications\n");
     }
     CMwake_server_thread(conn->cm);
 }